

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O0

int __thiscall booster::streambuf::underflow(streambuf *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  io_device *piVar5;
  undefined4 extraout_var;
  vector<char,_std::allocator<char>_> *in_RDI;
  streamsize n;
  char *buf_ptr;
  streambuf *in_stack_ffffffffffffffc8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  reference pvVar7;
  vector<char,_std::allocator<char>_> *this_00;
  int local_4;
  long lVar6;
  
  this_00 = in_RDI;
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(in_stack_ffffffffffffffe0);
  if (!bVar1) {
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)
                       &in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                      );
    if (sVar3 <= *(ulong *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10) goto LAB_00225ebe;
  }
  std::vector<char,_std::allocator<char>_>::resize(this_00,in_stack_ffffffffffffffe8);
LAB_00225ebe:
  pvVar4 = std::vector<char,_std::allocator<char>_>::front(in_stack_ffffffffffffffd0);
  piVar5 = device(in_stack_ffffffffffffffc8);
  pvVar7 = pvVar4;
  sVar3 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)
                     &in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  iVar2 = (**piVar5->_vptr_io_device)(piVar5,pvVar4,sVar3);
  lVar6 = CONCAT44(extraout_var,iVar2);
  std::streambuf::setg((char *)in_RDI,pvVar7,pvVar7);
  if (lVar6 == 0) {
    local_4 = -1;
  }
  else {
    local_4 = (int)*pvVar7;
  }
  return local_4;
}

Assistant:

int streambuf::underflow()
	{
		if(buffer_in_.empty() || buffer_in_.size() > buffer_size_)
			buffer_in_.resize(buffer_size_);
		char *buf_ptr = &buffer_in_.front();
		std::streamsize n=device().read(buf_ptr,buffer_in_.size());
		setg(buf_ptr,buf_ptr,buf_ptr+n);
		if(n==0)
			return EOF;
		return *buf_ptr;
	}